

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O0

unsigned_long_long genrand64_int64(void)

{
  int iVar1;
  ulong uVar2;
  unsigned_long_long x;
  int i;
  int local_4;
  
  if (0x137 < mti) {
    if (mti == 0x139) {
      init_genrand64(0x1571);
    }
    for (local_4 = 0; local_4 < 0x9c; local_4 = local_4 + 1) {
      uVar2 = mt[local_4] & 0xffffffff80000000 | mt[local_4 + 1] & 0x7fffffff;
      mt[local_4] = mt[local_4 + 0x9c] ^ uVar2 >> 1 ^ genrand64_int64::mag01[(int)((uint)uVar2 & 1)]
      ;
    }
    for (; local_4 < 0x137; local_4 = local_4 + 1) {
      uVar2 = mt[local_4] & 0xffffffff80000000 | mt[local_4 + 1] & 0x7fffffff;
      mt[local_4] = mt[local_4 + -0x9c] ^ uVar2 >> 1 ^
                    genrand64_int64::mag01[(int)((uint)uVar2 & 1)];
    }
    uVar2 = mt[0x137] & 0xffffffff80000000 | mt[0] & 0x7fffffff;
    mt[0x137] = mt[0x9b] ^ uVar2 >> 1 ^ genrand64_int64::mag01[(int)((uint)uVar2 & 1)];
    mti = 0;
  }
  iVar1 = mti;
  mti = mti + 1;
  uVar2 = mt[iVar1] >> 0x1d & 0x5555555555555555 ^ mt[iVar1];
  uVar2 = (uVar2 & 0x38eb3ffff6d3) << 0x11 ^ uVar2;
  uVar2 = (uVar2 & 0x7ffbf77) << 0x25 ^ uVar2;
  return uVar2 >> 0x2b ^ uVar2;
}

Assistant:

unsigned long long genrand64_int64(void)
{
    int i;
    unsigned long long x;
    static unsigned long long mag01[2]={0ULL, MATRIX_A};

    if (mti >= NN) { /* generate NN words at one time */

        /* if init_genrand64() has not been called, */
        /* a default initial seed is used     */
        if (mti == NN+1) 
            init_genrand64(5489ULL); 

        for (i=0;i<NN-MM;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+MM] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        for (;i<NN-1;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+(MM-NN)] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        x = (mt[NN-1]&UM)|(mt[0]&LM);
        mt[NN-1] = mt[MM-1] ^ (x>>1) ^ mag01[(int)(x&1ULL)];

        mti = 0;
    }
  
    x = mt[mti++];

    x ^= (x >> 29) & 0x5555555555555555ULL;
    x ^= (x << 17) & 0x71D67FFFEDA60000ULL;
    x ^= (x << 37) & 0xFFF7EEE000000000ULL;
    x ^= (x >> 43);

    return x;
}